

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unwind_type.hpp
# Opt level: O0

result_type
boost::python::detail::
unwind_type<boost::python::converter::detail::unwind_type_id_helper,unsigned_int>
          (type<unsigned_int> *param_1,unwind_type_id_helper *param_2)

{
  result_type rVar1;
  _func_uint *in_RSI;
  
  rVar1 = unwind_helper2<0>::
          execute<boost::python::converter::detail::unwind_type_id_helper,unsigned_int>
                    (in_RSI,(unwind_type_id_helper *)0x3e9099);
  return (result_type)rVar1.m_base_type;
}

Assistant:

unwind_type(boost::type<U>*p =0, Generator* =0)
#endif
{
    BOOST_STATIC_CONSTANT(int, indirection
        = (is_pointer<U>::value ? pointer_ : 0)
                             + (indirect_traits::is_reference_to_pointer<U>::value
                             ? reference_to_pointer_
                             : is_lvalue_reference<U>::value
                             ? reference_
                             : 0));

    return unwind_helper2<indirection>::execute((U(*)())0,(Generator*)0);
}